

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# choc_Value.h
# Opt level: O0

void __thiscall
choc::value::Value::importStringHandles(choc::value::ValueView&,choc::value::
StringDictionary_const&)::StringHandleImporter::importStrings(choc::value::ValueView__
          (void *this,ValueView *v)

{
  StringDictionary *pSVar1;
  bool bVar2;
  uint uVar3;
  Handle v_00;
  Type *this_00;
  undefined1 auVar4 [16];
  undefined1 local_f8 [8];
  ValueView member;
  uint32_t i;
  uint32_t numMembers;
  ValueView element;
  undefined1 local_78 [7];
  EndIterator __end6;
  Iterator __begin6;
  ValueView *__range6;
  Handle oldHandle;
  ValueView *v_local;
  StringHandleImporter *this_local;
  
  this_00 = ValueView::getType(v);
  bVar2 = Type::usesStrings(this_00);
  if (bVar2) {
    bVar2 = ValueView::isString(v);
    if (bVar2) {
      uVar3 = ValueView::readContentAs<unsigned_int>(v);
      pSVar1 = v->stringDictionary;
      auVar4 = (**(code **)(**this + 0x18))(*this,uVar3);
      v_00.handle = (*pSVar1->_vptr_StringDictionary[2])(pSVar1,auVar4._0_8_,auVar4._8_8_);
      ValueView::setUnchecked<choc::value::StringDictionary::Handle>(v,v_00);
    }
    else {
      bVar2 = ValueView::isArray(v);
      if (bVar2) {
        ValueView::begin((Iterator *)local_78,v);
        ValueView::end(v);
        while (bVar2 = ValueView::Iterator::operator!=((Iterator *)local_78), bVar2) {
          ValueView::Iterator::operator*((ValueView *)&i,(Iterator *)local_78);
          ValueView__(this,(ValueView *)&i);
          ValueView::~ValueView((ValueView *)&i);
          ValueView::Iterator::operator++((Iterator *)local_78);
        }
        ValueView::Iterator::~Iterator((Iterator *)local_78);
      }
      else {
        bVar2 = ValueView::isObject(v);
        if (bVar2) {
          member.stringDictionary._4_4_ = ValueView::size(v);
          for (member.stringDictionary._0_4_ = 0;
              (uint)member.stringDictionary < member.stringDictionary._4_4_;
              member.stringDictionary._0_4_ = (uint)member.stringDictionary + 1) {
            ValueView::operator[]((ValueView *)local_f8,v,(uint)member.stringDictionary);
            ValueView__(this,(ValueView *)local_f8);
            ValueView::~ValueView((ValueView *)local_f8);
          }
        }
      }
    }
  }
  return;
}

Assistant:

void importStrings (ValueView& v)
        {
            if (v.getType().usesStrings())
            {
                if (v.isString())
                {
                    auto oldHandle = StringDictionary::Handle { v.readContentAs<decltype (StringDictionary::Handle::handle)>() };
                    v.setUnchecked (v.stringDictionary->getHandleForString (oldDic.getStringForHandle (oldHandle)));
                }
                else if (v.isArray())
                {
                    for (auto element : v)
                        importStrings (element);
                }
                else if (v.isObject())
                {
                    auto numMembers = v.size();

                    for (uint32_t i = 0; i < numMembers; ++i)
                    {
                        auto member = v[i];
                        importStrings (member);
                    }
                }
            }
        }